

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O2

void __thiscall
t_ocaml_generator::generate_serialize_list_element
          (t_ocaml_generator *this,ostream *out,t_list *tlist,string *iter)

{
  t_type *type;
  t_field efield;
  allocator local_111;
  string local_110;
  string local_f0;
  t_field local_d0;
  
  type = tlist->elem_type_;
  std::__cxx11::string::string((string *)&local_f0,(string *)iter);
  t_field::t_field(&local_d0,type,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::string((string *)&local_110,"",&local_111);
  generate_serialize_field(this,out,&local_d0,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  t_field::~t_field(&local_d0);
  return;
}

Assistant:

void t_ocaml_generator::generate_serialize_list_element(ostream& out, t_list* tlist, string iter) {
  t_field efield(tlist->get_elem_type(), iter);
  generate_serialize_field(out, &efield);
}